

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O2

void narrow_stripov_backprop(NarrowConv *nc,IRRef ref,int depth)

{
  byte bVar1;
  IRIns *pIVar2;
  NarrowIns *pNVar3;
  NarrowIns *pNVar4;
  IRRef *pIVar5;
  BPropEntry *pBVar6;
  ulong uVar7;
  NarrowIns *savesp;
  
  pIVar2 = (nc->J->cur).ir;
  uVar7 = (ulong)ref;
  bVar1 = *(byte *)((long)pIVar2 + uVar7 * 8 + 5);
  if ((bVar1 - 0x35 < 2) || ((bVar1 == 0x37 && ((nc->mode & 0xf000) == 0x1000)))) {
    pBVar6 = narrow_bpc_get(nc->J,(IRRef1)ref,0);
    if (pBVar6 == (BPropEntry *)0x0) {
      if ((depth < 99) && (pNVar3 = nc->sp, pNVar3 < nc->maxsp)) {
        narrow_stripov_backprop(nc,(uint)pIVar2[uVar7].field_0.op1,depth + 1);
        if (nc->sp < nc->maxsp) {
          narrow_stripov_backprop(nc,(uint)*(ushort *)((long)pIVar2 + uVar7 * 8 + 2),depth + 1);
          pNVar4 = nc->sp;
          if (pNVar4 < nc->maxsp) {
            bVar1 = *(byte *)((long)pIVar2 + uVar7 * 8 + 5);
            nc->sp = pNVar4 + 1;
            *pNVar4 = (uint)bVar1 * 0x1000000 + ref + 0xf4130000;
            return;
          }
        }
        nc->sp = pNVar3;
      }
    }
    else {
      ref = (IRRef)pBVar6->val;
    }
  }
  pIVar5 = nc->sp;
  nc->sp = pIVar5 + 1;
  *pIVar5 = ref;
  return;
}

Assistant:

static void narrow_stripov_backprop(NarrowConv *nc, IRRef ref, int depth)
{
  jit_State *J = nc->J;
  IRIns *ir = IR(ref);
  if (ir->o == IR_ADDOV || ir->o == IR_SUBOV ||
      (ir->o == IR_MULOV && (nc->mode & IRCONV_CONVMASK) == IRCONV_ANY)) {
    BPropEntry *bp = narrow_bpc_get(nc->J, ref, IRCONV_TOBIT);
    if (bp) {
      ref = bp->val;
    } else if (++depth < NARROW_MAX_BACKPROP && nc->sp < nc->maxsp) {
      NarrowIns *savesp = nc->sp;
      narrow_stripov_backprop(nc, ir->op1, depth);
      if (nc->sp < nc->maxsp) {
	narrow_stripov_backprop(nc, ir->op2, depth);
	if (nc->sp < nc->maxsp) {
	  *nc->sp++ = NARROWINS(IRT(ir->o - IR_ADDOV + IR_ADD, IRT_INT), ref);
	  return;
	}
      }
      nc->sp = savesp;  /* Path too deep, need to backtrack. */
    }
  }
  *nc->sp++ = NARROWINS(NARROW_REF, ref);
}